

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O2

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_SubscribeToCommands
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,
          IOTHUB_CLIENT_COMMAND_CALLBACK_ASYNC commandCallback,void *userContextCallback)

{
  IOTHUB_CLIENT_RESULT IVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  LOG_CATEGORY LVar4;
  char *pcVar5;
  
  if (iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_INVALID_ARG;
    }
    pcVar5 = "result = %s";
    LVar4 = AZ_LOG_ERROR;
    iVar2 = 0xa79;
    IVar1 = IOTHUB_CLIENT_INVALID_ARG;
  }
  else {
    IVar1 = VerifyMethodCallbackType
                      (iotHubClientHandle,CALLBACK_TYPE_COMMAND,
                       commandCallback == (IOTHUB_CLIENT_COMMAND_CALLBACK_ASYNC)0x0);
    if (IVar1 == IOTHUB_CLIENT_OK) {
      if (commandCallback == (IOTHUB_CLIENT_COMMAND_CALLBACK_ASYNC)0x0) {
        (*iotHubClientHandle->IoTHubTransport_Unsubscribe_DeviceMethod)
                  (iotHubClientHandle->deviceHandle);
        (iotHubClientHandle->methodCallback).type = CALLBACK_TYPE_NONE;
        (iotHubClientHandle->methodCallback).deviceMethodCallback =
             (IOTHUB_CLIENT_DEVICE_METHOD_CALLBACK_ASYNC)0x0;
        (iotHubClientHandle->methodCallback).inboundDeviceMethodCallback =
             (IOTHUB_CLIENT_INBOUND_DEVICE_METHOD_CALLBACK)0x0;
        (iotHubClientHandle->methodCallback).commandCallback =
             (IOTHUB_CLIENT_COMMAND_CALLBACK_ASYNC)0x0;
        (iotHubClientHandle->methodCallback).userContextCallback = (void *)0x0;
      }
      else {
        iVar2 = (*iotHubClientHandle->IoTHubTransport_Subscribe_DeviceMethod)
                          (iotHubClientHandle->deviceHandle);
        if (iVar2 != 0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                      ,"IoTHubClientCore_LL_SubscribeToCommands",0xa95,1,
                      "IoTHubTransport_Subscribe_DeviceMethod failed");
          }
          (iotHubClientHandle->methodCallback).type = CALLBACK_TYPE_NONE;
          (iotHubClientHandle->methodCallback).deviceMethodCallback =
               (IOTHUB_CLIENT_DEVICE_METHOD_CALLBACK_ASYNC)0x0;
          (iotHubClientHandle->methodCallback).inboundDeviceMethodCallback =
               (IOTHUB_CLIENT_INBOUND_DEVICE_METHOD_CALLBACK)0x0;
          (iotHubClientHandle->methodCallback).commandCallback =
               (IOTHUB_CLIENT_COMMAND_CALLBACK_ASYNC)0x0;
          (iotHubClientHandle->methodCallback).userContextCallback = (void *)0x0;
          return IOTHUB_CLIENT_ERROR;
        }
        (iotHubClientHandle->methodCallback).type = CALLBACK_TYPE_COMMAND;
        (iotHubClientHandle->methodCallback).commandCallback = commandCallback;
        (iotHubClientHandle->methodCallback).userContextCallback = userContextCallback;
      }
      return IOTHUB_CLIENT_OK;
    }
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return IVar1;
    }
    pcVar5 = "Incorrect callback type";
    iVar2 = 0xa82;
    LVar4 = AZ_LOG_INFO;
  }
  (*p_Var3)(LVar4,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
            ,"IoTHubClientCore_LL_SubscribeToCommands",iVar2,1,pcVar5);
  return IVar1;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_SubscribeToCommands(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, IOTHUB_CLIENT_COMMAND_CALLBACK_ASYNC commandCallback, void* userContextCallback)
{
    IOTHUB_CLIENT_RESULT result;

    if (iotHubClientHandle == NULL)
    {
        result = IOTHUB_CLIENT_INVALID_ARG;
        LOG_ERROR_RESULT;
    }
    else
    {
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)iotHubClientHandle;
        bool unsubscribing = (commandCallback == NULL);

        if ((result = VerifyMethodCallbackType(handleData, CALLBACK_TYPE_COMMAND, unsubscribing)) != IOTHUB_CLIENT_OK)
        {
            LogInfo("Incorrect callback type");
        }
        else if (unsubscribing)
        {
            handleData->IoTHubTransport_Unsubscribe_DeviceMethod(handleData->deviceHandle);
            ResetMethodCallbackData(handleData);
            result = IOTHUB_CLIENT_OK;
        }
        else
        {
            if (handleData->IoTHubTransport_Subscribe_DeviceMethod(handleData->deviceHandle) == 0)
            {
                handleData->methodCallback.type = CALLBACK_TYPE_COMMAND;
                handleData->methodCallback.commandCallback = commandCallback;
                handleData->methodCallback.userContextCallback = userContextCallback;
                result = IOTHUB_CLIENT_OK;
            }
            else
            {
                LogError("IoTHubTransport_Subscribe_DeviceMethod failed");
                ResetMethodCallbackData(handleData);
                result = IOTHUB_CLIENT_ERROR;
            }
        }
    }

    return result;
}